

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash64.c
# Opt level: O0

hwaddr ppc_hash64_get_phys_page_debug(PowerPCCPU_conflict3 *cpu,target_ulong addr)

{
  _Bool _Var1;
  int iVar2;
  target_ulong tVar3;
  hwaddr hVar4;
  uint64_t uVar5;
  target_ulong limit;
  undefined1 local_68 [4];
  uint apshift;
  ppc_hash_pte64_t pte;
  hwaddr raddr;
  hwaddr ptex;
  ppc_slb_t *slb;
  ppc_slb_t vrma_slbe;
  CPUPPCState_conflict2 *env;
  target_ulong addr_local;
  PowerPCCPU_conflict3 *cpu_local;
  
  vrma_slbe.sps = (PPCHash64SegmentPageSizes *)&cpu->env;
  if (((cpu->env).msr >> 4 & 1) == 0) {
    pte.pte1 = addr & 0xfffffffffffffff;
    if (((((cpu->env).msr >> 0x3c & 1) != 0) || (((cpu->env).has_hv_mode & 1U) == 0)) &&
       (-1 < (long)addr)) {
      return pte.pte1 | (cpu->env).spr[0x139];
    }
    _Var1 = ppc_hash64_use_vrma((CPUPPCState_conflict2 *)vrma_slbe.sps);
    if (!_Var1) {
      tVar3 = rmls_limit(cpu);
      if (tVar3 <= pte.pte1) {
        return 0xffffffffffffffff;
      }
      return pte.pte1 | (ulong)vrma_slbe.sps[0x4a].enc[0];
    }
    ptex = (hwaddr)&slb;
    iVar2 = build_vrma_slbe(cpu,(ppc_slb_t *)ptex);
    if (iVar2 != 0) {
      return 0xffffffffffffffff;
    }
  }
  else {
    ptex = (hwaddr)slb_lookup(cpu,addr);
    if ((ppc_slb_t *)ptex == (ppc_slb_t *)0x0) {
      return 0xffffffffffffffff;
    }
  }
  hVar4 = ppc_hash64_htab_lookup
                    (cpu,(ppc_slb_t *)ptex,addr,(ppc_hash_pte64_t *)local_68,
                     (uint *)((long)&limit + 4));
  if (hVar4 == 0xffffffffffffffff) {
    cpu_local = (PowerPCCPU_conflict3 *)0xffffffffffffffff;
  }
  else {
    uVar5 = deposit64(pte.pte0 & 0xffffffffffff000,0,limit._4_4_,addr);
    cpu_local = (PowerPCCPU_conflict3 *)(uVar5 & 0xfffffffffffff000);
  }
  return (hwaddr)cpu_local;
}

Assistant:

hwaddr ppc_hash64_get_phys_page_debug(PowerPCCPU *cpu, target_ulong addr)
{
    CPUPPCState *env = &cpu->env;
    ppc_slb_t vrma_slbe;
    ppc_slb_t *slb;
    hwaddr ptex, raddr;
    ppc_hash_pte64_t pte;
    unsigned apshift;

    /* Handle real mode */
    if (msr_dr == 0) {
        /* In real mode the top 4 effective address bits are ignored */
        raddr = addr & 0x0FFFFFFFFFFFFFFFULL;

#if 0
        if (cpu->vhyp) {
            /*
             * In virtual hypervisor mode, there's nothing to do:
             *   EA == GPA == qemu guest address
             */
            return raddr;
        } else
#endif
        if ((msr_hv || !env->has_hv_mode) && !(addr >> 63)) {
            /* In HV mode, add HRMOR if top EA bit is clear */
            return raddr | env->spr[SPR_HRMOR];
        } else if (ppc_hash64_use_vrma(env)) {
            /* Emulated VRMA mode */
            slb = &vrma_slbe;
            if (build_vrma_slbe(cpu, slb) != 0) {
                return -1;
            }
        } else {
            target_ulong limit = rmls_limit(cpu);

            /* Emulated old-style RMO mode, bounds check against RMLS */
            if (raddr >= limit) {
                return -1;
            }
            return raddr | env->spr[SPR_RMOR];
        }
    } else {
        slb = slb_lookup(cpu, addr);
        if (!slb) {
            return -1;
        }
    }

    ptex = ppc_hash64_htab_lookup(cpu, slb, addr, &pte, &apshift);
    if (ptex == -1) {
        return -1;
    }

    return deposit64(pte.pte1 & HPTE64_R_RPN, 0, apshift, addr)
        & TARGET_PAGE_MASK;
}